

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

iterator __thiscall
eastl::vector<eastl::pair<char,_int>,_eastl::allocator>::erase
          (vector<eastl::pair<char,_int>,_eastl::allocator> *this,iterator position)

{
  iterator position_local;
  vector<eastl::pair<char,_int>,_eastl::allocator> *this_local;
  
  if (position + 1 < (this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd) {
    copy<eastl::pair<char,int>*,eastl::pair<char,int>*>
              (position + 1,(this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd
               ,position);
  }
  (this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd =
       (this->super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>).mpEnd + -1;
  return position;
}

Assistant:

inline typename vector<T, Allocator>::iterator
    vector<T, Allocator>::erase(iterator position)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position >= mpEnd)))
                EASTL_FAIL_MSG("vector::erase -- invalid position");
#endif

        if((position + 1) < mpEnd)
            eastl::copy(position + 1, mpEnd, position);
        --mpEnd;
        mpEnd->~value_type();
        return position;
    }